

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

Names * __thiscall
cmGeneratorTarget::GetExecutableNames
          (Names *__return_storage_ptr__,cmGeneratorTarget *this,string *config)

{
  string *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  cmGeneratorTarget *this_00;
  bool bVar3;
  TargetType TVar4;
  string *psVar5;
  char *pcVar6;
  long *plVar7;
  size_type *psVar8;
  string msg;
  string prefix;
  string suffix;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  cmGeneratorTarget *local_60;
  string *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->Base)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->Base).field_2
  ;
  (__return_storage_ptr__->Base)._M_string_length = 0;
  (__return_storage_ptr__->Base).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->Output)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->Output).field_2;
  (__return_storage_ptr__->Output)._M_string_length = 0;
  (__return_storage_ptr__->Output).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->Real)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->Real).field_2
  ;
  (__return_storage_ptr__->Real)._M_string_length = 0;
  (__return_storage_ptr__->Real).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->ImportLibrary)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->ImportLibrary).field_2;
  (__return_storage_ptr__->ImportLibrary)._M_string_length = 0;
  (__return_storage_ptr__->ImportLibrary).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->PDB)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->PDB).field_2;
  (__return_storage_ptr__->PDB)._M_string_length = 0;
  (__return_storage_ptr__->PDB).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->SharedObject)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->SharedObject).field_2;
  (__return_storage_ptr__->SharedObject)._M_string_length = 0;
  (__return_storage_ptr__->SharedObject).field_2._M_local_buf[0] = '\0';
  local_58 = config;
  bVar3 = cmTarget::IsImported(this->Target);
  paVar2 = &local_e0.field_2;
  if (bVar3) {
    local_a0._M_dataplus._M_p = (pointer)0x2e;
    local_e0._M_dataplus._M_p = (pointer)paVar2;
    local_e0._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_e0,(ulong)&local_a0);
    local_e0.field_2._M_allocated_capacity = (size_type)local_a0._M_dataplus._M_p;
    builtin_strncpy(local_e0._M_dataplus._M_p,"GetExecutableNames called on imported target: ",0x2e)
    ;
    local_e0._M_string_length = (size_type)local_a0._M_dataplus._M_p;
    local_e0._M_dataplus._M_p[(long)local_a0._M_dataplus._M_p] = '\0';
    psVar5 = cmTarget::GetName_abi_cxx11_(this->Target);
    std::__cxx11::string::_M_append((char *)&local_e0,(ulong)(psVar5->_M_dataplus)._M_p);
    cmLocalGenerator::IssueMessage(this->LocalGenerator,INTERNAL_ERROR,&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != paVar2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
  }
  local_e0._M_string_length = 7;
  local_e0.field_2._M_allocated_capacity = 0x4e4f4953524556;
  local_e0._M_dataplus._M_p = (pointer)paVar2;
  pcVar6 = GetProperty(this,&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  TVar4 = cmTarget::GetType(this->Target);
  bVar3 = true;
  if (TVar4 == EXECUTABLE) {
    local_e0.field_2._M_allocated_capacity._0_6_ = 0x45444f4358;
    local_e0._M_string_length = 5;
    local_e0._M_dataplus._M_p = (pointer)paVar2;
    bVar3 = cmMakefile::IsOn(this->Makefile,&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != paVar2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
  }
  psVar5 = local_58;
  if (bVar3 != false) {
    pcVar6 = (char *)0x0;
  }
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  local_a0._M_string_length = 0;
  local_a0.field_2._M_local_buf[0] = '\0';
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  local_80._M_string_length = 0;
  local_80.field_2._M_local_buf[0] = '\0';
  GetFullNameInternal(this,local_58,RuntimeBinaryArtifact,&local_a0,&__return_storage_ptr__->Base,
                      &local_80);
  local_60 = this;
  std::operator+(&local_50,&local_a0,&__return_storage_ptr__->Base);
  plVar7 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_50,(ulong)local_80._M_dataplus._M_p);
  psVar8 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_c0.field_2._M_allocated_capacity = *psVar8;
    local_c0.field_2._8_8_ = plVar7[3];
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  }
  else {
    local_c0.field_2._M_allocated_capacity = *psVar8;
    local_c0._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_c0._M_string_length = plVar7[1];
  *plVar7 = (long)psVar8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->Output,(string *)&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  psVar1 = &__return_storage_ptr__->Real;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::_M_assign((string *)psVar1);
  this_00 = local_60;
  if (pcVar6 != (char *)0x0) {
    std::__cxx11::string::append((char *)psVar1);
    std::__cxx11::string::append((char *)psVar1);
  }
  GetFullNameInternal(&local_c0,this_00,psVar5,ImportLibraryArtifact);
  std::__cxx11::string::operator=
            ((string *)&__return_storage_ptr__->ImportLibrary,(string *)&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  GetPDBName(&local_c0,this_00,psVar5);
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->PDB,(string *)&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,
                    CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,
                             local_80.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,
                    CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,
                             local_a0.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

cmGeneratorTarget::Names cmGeneratorTarget::GetExecutableNames(
  const std::string& config) const
{
  cmGeneratorTarget::Names targetNames;

  // This should not be called for imported targets.
  // TODO: Split cmTarget into a class hierarchy to get compile-time
  // enforcement of the limited imported target API.
  if (this->IsImported()) {
    std::string msg = "GetExecutableNames called on imported target: ";
    msg += this->GetName();
    this->LocalGenerator->IssueMessage(MessageType::INTERNAL_ERROR, msg);
  }

// This versioning is supported only for executables and then only
// when the platform supports symbolic links.
#if defined(_WIN32) && !defined(__CYGWIN__)
  const char* version = 0;
#else
  // Check for executable version properties.
  const char* version = this->GetProperty("VERSION");
  if (this->GetType() != cmStateEnums::EXECUTABLE ||
      this->Makefile->IsOn("XCODE")) {
    version = nullptr;
  }
#endif

  // Get the components of the executable name.
  std::string prefix;
  std::string suffix;
  this->GetFullNameInternal(config, cmStateEnums::RuntimeBinaryArtifact,
                            prefix, targetNames.Base, suffix);

  // The executable name.
  targetNames.Output = prefix + targetNames.Base + suffix;

// The executable's real name on disk.
#if defined(__CYGWIN__)
  targetNames.Real = prefix + targetNames.Base;
#else
  targetNames.Real = targetNames.Output;
#endif
  if (version) {
    targetNames.Real += "-";
    targetNames.Real += version;
  }
#if defined(__CYGWIN__)
  targetNames.Real += suffix;
#endif

  // The import library name.
  targetNames.ImportLibrary =
    this->GetFullNameInternal(config, cmStateEnums::ImportLibraryArtifact);

  // The program database file name.
  targetNames.PDB = this->GetPDBName(config);

  return targetNames;
}